

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void GlobOpt::MarkNonByteCodeUsed(Opnd *opnd)

{
  OpndKind OVar1;
  IndirOpnd *pIVar2;
  RegOpnd *pRVar3;
  RegOpnd *indexOpnd;
  Opnd *opnd_local;
  
  OVar1 = IR::Opnd::GetKind(opnd);
  if (OVar1 == OpndKindReg) {
    pRVar3 = IR::Opnd::AsRegOpnd(opnd);
    IR::Opnd::SetIsJITOptimizedReg(&pRVar3->super_Opnd,true);
  }
  else if (OVar1 == OpndKindIndir) {
    pIVar2 = IR::Opnd::AsIndirOpnd(opnd);
    pRVar3 = IR::IndirOpnd::GetBaseOpnd(pIVar2);
    IR::Opnd::SetIsJITOptimizedReg(&pRVar3->super_Opnd,true);
    pIVar2 = IR::Opnd::AsIndirOpnd(opnd);
    pRVar3 = IR::IndirOpnd::GetIndexOpnd(pIVar2);
    if (pRVar3 != (RegOpnd *)0x0) {
      IR::Opnd::SetIsJITOptimizedReg(&pRVar3->super_Opnd,true);
    }
  }
  return;
}

Assistant:

void
GlobOpt::MarkNonByteCodeUsed(IR::Opnd * opnd)
{
    switch(opnd->GetKind())
    {
    case IR::OpndKindReg:
        opnd->AsRegOpnd()->SetIsJITOptimizedReg(true);
        break;
    case IR::OpndKindIndir:
        opnd->AsIndirOpnd()->GetBaseOpnd()->SetIsJITOptimizedReg(true);
        {
            IR::RegOpnd * indexOpnd = opnd->AsIndirOpnd()->GetIndexOpnd();
            if (indexOpnd)
            {
                indexOpnd->SetIsJITOptimizedReg(true);
            }
        }
        break;
    }
}